

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void __thiscall
Fossilize::ConcurrentDatabase::prime_read_only_hashes
          (ConcurrentDatabase *this,DatabaseInterface *interface)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  unsigned_long *hash;
  pointer __v;
  _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  uint i;
  ulong uVar4;
  size_t num_hashes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  allocator_type local_59;
  size_type local_58;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_50;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_50 = this->primed_hashes;
  uVar4 = 0;
  while( true ) {
    if (uVar4 == 10) {
      return;
    }
    iVar3 = (*interface->_vptr_DatabaseInterface[6])(interface,uVar4 & 0xffffffff,&local_58,0);
    if ((char)iVar3 == '\0') break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,local_58,&local_59
              );
    iVar3 = (*interface->_vptr_DatabaseInterface[6])(interface,uVar4 & 0xffffffff,&local_58);
    puVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
    if ((char)iVar3 == '\0') {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
      return;
    }
    this_00 = (_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)(local_50 + uVar4);
    for (__v = local_48._M_impl.super__Vector_impl_data._M_start; __v != puVar1; __v = __v + 1) {
      bVar2 = DatabaseInterface::test_resource_filter
                        (&this->super_DatabaseInterface,(ResourceTag)uVar4,*__v);
      if (bVar2) {
        std::__detail::
        _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert(this_00,__v);
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void prime_read_only_hashes(DatabaseInterface &interface)
	{
		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = static_cast<ResourceTag>(i);
			size_t num_hashes;
			if (!interface.get_hash_list_for_resource_tag(tag, &num_hashes, nullptr))
				return;
			std::vector<Hash> hashes(num_hashes);
			if (!interface.get_hash_list_for_resource_tag(tag, &num_hashes, hashes.data()))
				return;

			for (auto &hash : hashes)
				if (test_resource_filter(tag, hash))
					primed_hashes[i].insert(hash);
		}
	}